

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InstanceConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceConfigRuleSyntax,slang::syntax::InstanceConfigRuleSyntax_const&>
          (BumpAllocator *this,InstanceConfigRuleSyntax *args)

{
  InstanceConfigRuleSyntax *this_00;
  
  this_00 = (InstanceConfigRuleSyntax *)allocate(this,0x88,8);
  slang::syntax::InstanceConfigRuleSyntax::InstanceConfigRuleSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }